

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_util.h
# Opt level: O0

char * getenv_string_abi_cxx11_(char *name)

{
  char *pcVar1;
  char *in_RSI;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *env;
  char *name_local;
  
  local_20 = (char *)0x0;
  name_local = name;
  pcVar1 = getenv(in_RSI);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)name,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)name,pcVar1,local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  return name;
}

Assistant:

inline std::string getenv_string ( const char* name){

    const char* env = nullptr;

#if defined(_WIN32)
    char buffer[1024];
    auto rc = GetEnvironmentVariable(name, buffer, 1024);
    if (0 != rc && rc <= 1024) {
        env = buffer;
    }
#else
    env = getenv(name);
#endif

    if ((nullptr == env))
        return "";
    return std::string(env);
}